

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinDeserializer<std::__cxx11::string,void>::
     deserialize_elems<std::ifstream>(long *param_1,char param_2,char *param_3)

{
  char *elem;
  long lVar1;
  long lVar2;
  
  std::__cxx11::string::resize((ulong)param_1,param_2);
  lVar2 = param_1[1];
  if (lVar2 != 0) {
    lVar1 = *param_1;
    do {
      std::istream::read(param_3,lVar1);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::false_type  /* no insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    resize(has_resize<Sequence>{}, s, size);

    deserialize_elems_noinsert(
      is_sequence_batch_deserializable<Sequence>{},
      is_proxy_sequence<Sequence>{},
      s, size, istream
    );
  }